

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tn93_shared.cc
# Opt level: O0

int readFASTA(FILE *F,char *automatonState,StringBuffer *names,StringBuffer *sequences,
             Vector *nameLengths,Vector *seqLengths,long *firstSequenceLength,bool oneByOne,
             Vector *sequenceInstances,char sep,double include_prob,bool progress)

{
  Vector *pVVar1;
  StringBuffer *this;
  char cVar2;
  int iVar3;
  string *psVar4;
  char *pcVar5;
  ostream *poVar6;
  unsigned_long uVar7;
  string *psVar8;
  StringBuffer *in_RCX;
  StringBuffer *in_RDX;
  char *in_RSI;
  FILE *in_RDI;
  Vector *in_R8;
  double in_XMM0_Qa;
  double dVar9;
  long *in_stack_00000008;
  byte in_stack_00000010;
  Vector *in_stack_00000018;
  char in_stack_00000020;
  byte in_stack_00000028;
  string err;
  char err_1 [256];
  long k;
  unsigned_long resampled_prob;
  long ll;
  long sep_loc;
  unsigned_long count;
  long this_name_l;
  int currentC;
  long read_counter;
  bool include_me;
  time_t after;
  time_t before;
  unsigned_long up_to;
  unsigned_long in_stack_fffffffffffffcc0;
  Vector *in_stack_fffffffffffffcc8;
  StringBuffer *in_stack_fffffffffffffcd0;
  Vector *in_stack_fffffffffffffcf0;
  StringBuffer *in_stack_fffffffffffffcf8;
  ostream *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  _Setprecision in_stack_fffffffffffffd0c;
  StringBuffer *in_stack_fffffffffffffd10;
  allocator local_1d9;
  char local_1d8 [260];
  int local_d4;
  int local_d0;
  int local_cc;
  ulong local_c8;
  ulong local_c0;
  unsigned_long local_b8;
  ulong local_b0;
  ulong local_a8;
  undefined1 local_9a;
  allocator local_99;
  long local_98;
  int local_7c;
  long local_78;
  byte local_69;
  time_t local_68;
  time_t local_60;
  ulong local_58;
  byte local_49;
  double local_48;
  byte local_39;
  Vector *local_30;
  StringBuffer *local_28;
  StringBuffer *local_20;
  char *local_18;
  FILE *local_10;
  
  local_39 = in_stack_00000010 & 1;
  local_49 = in_stack_00000028 & 1;
  local_58 = 0;
  local_48 = in_XMM0_Qa;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (local_39 != 0) {
    StringBuffer::resetString(in_RCX);
    StringBuffer::resetString(local_20);
    local_48 = 1.0;
  }
  if (local_48 < 1.0) {
    local_58 = (ulong)(local_48 * 4294967295.0);
    local_58 = local_58 |
               (long)(local_48 * 4294967295.0 - 9.223372036854776e+18) & (long)local_58 >> 0x3f;
  }
  if ((local_49 & 1) != 0) {
    time(&local_60);
  }
  local_69 = 1;
  local_78 = 0;
  flockfile(local_10);
  do {
    while( true ) {
      do {
        do {
          while( true ) {
            while( true ) {
              while( true ) {
                local_7c = getc_unlocked(local_10);
                iVar3 = feof_unlocked(local_10);
                if (iVar3 != 0) {
                  if ((*local_18 != '\x02') && (((local_39 & 1) == 0 || (*local_18 != '\0')))) {
                    snprintf(local_1d8,0xff,"Unexpected end of file: state %d",
                             (ulong)(uint)(int)*local_18);
                    psVar8 = (string *)__cxa_allocate_exception(0x20);
                    psVar4 = psVar8;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(psVar4,local_1d8,&local_1d9);
                    __cxa_throw(psVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
                               );
                  }
                  if ((local_69 & 1) != 0) {
                    if ((local_39 & 1) != 0) {
                      if (*in_stack_00000008 == 0) {
                        uVar7 = StringBuffer::length(local_28);
                        *in_stack_00000008 = uVar7 - 1;
                      }
                      *local_18 = '\0';
                      StringBuffer::appendChar
                                (in_stack_fffffffffffffcd0,
                                 (char)((ulong)in_stack_fffffffffffffcc8 >> 0x38));
                      funlockfile(local_10);
                      return 3;
                    }
                    addASequenceToList(in_stack_fffffffffffffd10,
                                       (Vector *)
                                       CONCAT44(in_stack_fffffffffffffd0c._M_n,
                                                in_stack_fffffffffffffd08),
                                       (long *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                                       in_stack_fffffffffffffcf0);
                  }
                  *local_18 = '\x01';
                  return 0;
                }
                cVar2 = *local_18;
                if (cVar2 != '\0') break;
                if ((((local_7c == 0x3e) || (local_7c == 0x23)) &&
                    (*local_18 = '\x01', in_stack_00000018 == (Vector *)0x0)) && (local_48 < 1.0)) {
                  uVar7 = genrand_int32();
                  local_69 = uVar7 < local_58;
                }
              }
              if (cVar2 == '\x01') break;
              if (cVar2 == '\x02') {
                local_7c = toupper(local_7c);
                if (validFlags[local_7c] < '\0') {
                  if ((local_7c == 0x3e) || (local_7c == 0x23)) {
                    *local_18 = '\x01';
                    if ((local_69 & 1) != 0) {
                      if ((local_39 & 1) != 0) {
                        if (*in_stack_00000008 == 0) {
                          uVar7 = StringBuffer::length(local_28);
                          *in_stack_00000008 = uVar7 - 1;
                        }
                        *local_18 = '\0';
                        StringBuffer::appendChar
                                  (in_stack_fffffffffffffcd0,
                                   (char)((ulong)in_stack_fffffffffffffcc8 >> 0x38));
                        ungetc(local_7c,local_10);
                        funlockfile(local_10);
                        return 2;
                      }
                      addASequenceToList(in_stack_fffffffffffffd10,
                                         (Vector *)
                                         CONCAT44(in_stack_fffffffffffffd0c._M_n,
                                                  in_stack_fffffffffffffd08),
                                         (long *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8
                                         ,in_stack_fffffffffffffcf0);
                      local_78 = local_78 + 1;
                      if (((local_49 & 1) != 0) && (local_78 % 0x400 == 0)) {
                        time(&local_68);
                        poVar6 = std::operator<<((ostream *)&std::cerr,
                                                 "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress:"
                                                );
                        local_cc = (int)std::setw(8);
                        poVar6 = std::operator<<(poVar6,(_Setw)local_cc);
                        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_78);
                        poVar6 = std::operator<<(poVar6," sequences read (");
                        local_d0 = (int)std::setw(0xc);
                        in_stack_fffffffffffffd10 =
                             (StringBuffer *)std::operator<<(poVar6,(_Setw)local_d0);
                        in_stack_fffffffffffffd0c = std::setprecision(3);
                        local_d4 = in_stack_fffffffffffffd0c._M_n;
                        in_stack_fffffffffffffd00 =
                             std::operator<<((ostream *)in_stack_fffffffffffffd10,
                                             in_stack_fffffffffffffd0c);
                        in_stack_fffffffffffffcf0 = (Vector *)(double)local_78;
                        dVar9 = difftime(local_68,local_60);
                        in_stack_fffffffffffffcf8 =
                             (StringBuffer *)
                             std::ostream::operator<<
                                       (in_stack_fffffffffffffd00,
                                        (double)in_stack_fffffffffffffcf0 / dVar9);
                        std::operator<<((ostream *)in_stack_fffffffffffffcf8," seqs/sec)");
                        local_68 = local_60;
                      }
                    }
                    if ((in_stack_00000018 != (Vector *)0x0) || (1.0 <= local_48)) {
                      local_69 = 1;
                    }
                    else {
                      uVar7 = genrand_int32();
                      local_69 = uVar7 < local_58;
                    }
                  }
                }
                else if ((local_69 & 1) != 0) {
                  StringBuffer::appendChar
                            (in_stack_fffffffffffffcd0,
                             (char)((ulong)in_stack_fffffffffffffcc8 >> 0x38));
                }
              }
            }
            cVar2 = (char)((ulong)in_stack_fffffffffffffcc8 >> 0x38);
            if ((local_7c == 10) || (local_7c == 0xd)) break;
            if ((local_69 & 1) != 0) {
              StringBuffer::appendChar(in_stack_fffffffffffffcd0,cVar2);
            }
          }
        } while ((local_69 & 1) == 0);
        StringBuffer::appendChar(in_stack_fffffffffffffcd0,cVar2);
        if ((local_39 & 1) == 0) {
          StringBuffer::length(local_20);
          Vector::appendValue((Vector *)in_stack_fffffffffffffcd0,(long)in_stack_fffffffffffffcc8);
          Vector::length(local_30);
          local_98 = stringLength(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
        }
        else {
          uVar7 = StringBuffer::length(local_20);
          local_98 = uVar7 - 1;
        }
        if (local_98 < 1) {
          local_9a = 1;
          psVar4 = (string *)__cxa_allocate_exception(0x20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(psVar4,"Sequence names must be non-empty.",&local_99);
          local_9a = 0;
          __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        *local_18 = '\x02';
      } while (in_stack_00000018 == (Vector *)0x0);
      local_a8 = 1;
      if (2 < local_98) break;
LAB_001074fd:
      if ((local_39 & 1) != 0) {
        Vector::resetVector(in_stack_00000018);
      }
      Vector::appendValue((Vector *)in_stack_fffffffffffffcd0,(long)in_stack_fffffffffffffcc8);
    }
    local_b0 = 0;
    local_b8 = StringBuffer::length(local_20);
    local_b0 = 2;
    while (((long)local_b0 < local_98 &&
           (cVar2 = StringBuffer::getChar(local_20,~local_b0 + local_b8), cVar2 != in_stack_00000020
           ))) {
      local_b0 = local_b0 + 1;
    }
    if ((long)local_b0 < local_98) {
      pcVar5 = StringBuffer::getString(local_20);
      iVar3 = atoi(pcVar5 + (local_b8 - local_b0));
      local_a8 = (ulong)iVar3;
    }
    if (local_a8 == 0) {
      local_a8 = 1;
    }
    local_c0 = 0;
    if (1.0 <= local_48) {
      local_c0 = local_a8;
    }
    else {
      for (local_c8 = 0; local_c8 < local_a8; local_c8 = local_c8 + 1) {
        uVar7 = genrand_int32();
        local_c0 = (uVar7 < local_58) + local_c0;
      }
    }
    this = local_20;
    pVVar1 = local_30;
    if (local_c0 != 0) {
      local_a8 = local_c0;
      goto LAB_001074fd;
    }
    if ((local_39 & 1) == 0) {
      uVar7 = Vector::length(local_30);
      uVar7 = Vector::value(pVVar1,uVar7 - 2);
      StringBuffer::reset_length(this,uVar7);
    }
    else {
      StringBuffer::resetString(local_20);
    }
    pVVar1 = local_30;
    uVar7 = Vector::length(local_30);
    Vector::remove(pVVar1,(char *)(uVar7 - 1));
    local_69 = 0;
  } while( true );
}

Assistant:

int readFASTA (FILE* F, char& automatonState,  StringBuffer &names, 
               StringBuffer& sequences, Vector &nameLengths, Vector &seqLengths, 
               long& firstSequenceLength, bool oneByOne, 
               Vector* sequenceInstances, char sep,
               double include_prob, bool progress) {
  
  unsigned long up_to = 0L;
  
  if (oneByOne) {
    sequences.resetString();
    names.resetString();
    include_prob = 1.;
  }
  
  if (include_prob < 1.) {
    up_to = RAND_RANGE * include_prob;
  }
    
  time_t before, after;
  if (progress) {
    time(&before);
  }

  
  bool include_me = true;
  long read_counter = 0;
    
  flockfile(F);
    
  try {
  
      while (1) {
        int currentC = getc_unlocked (F);
          //cout << "State: " << int(automatonState) << "/'" << char(currentC) << "'" << endl;
        if (feof_unlocked (F))
          break;
          
        switch (automatonState) {
          case 0: {
            if (currentC == '>' || currentC == '#') {
              automatonState = 1;
              if (sequenceInstances == NULL && include_prob < 1.) {
                include_me = genrand_int32() < up_to;
              }
            }
            break;
          }
          case 1: {
            if (currentC == '\n' || currentC == '\r') {
              if (include_me) {
                  names.appendChar   ('\0');
     
                long this_name_l;
                if (oneByOne) {
                  this_name_l = names.length ()-1;
                  
                } else {
                  nameLengths.appendValue (names.length());
                  this_name_l = stringLength (nameLengths, nameLengths.length()-2);
                }

                
                if (this_name_l <= 0) {
                  throw std::string("Sequence names must be non-empty.");
                }
                automatonState = 2;

                if (sequenceInstances) {
                    unsigned long count = 1L;
                   if (this_name_l >= 3) {
                      long sep_loc = 0, ll = names.length();
                      for (sep_loc = 2; sep_loc < this_name_l; sep_loc ++) {
                        if (names.getChar(ll-sep_loc-1) == sep) {
                          break;
                        }
                      }
                      if (sep_loc < this_name_l) {
                        count = atoi (names.getString() + (ll-sep_loc));
                      }
                      if (count < 1) {
                        count = 1;
                      }
                      
                      unsigned long resampled_prob = 0UL;
                      
                      if (include_prob < 1.) {
                        for (long k = 0; k < count; k ++) {
                          resampled_prob += genrand_int32() < up_to;
                        }
                      } else {
                        resampled_prob = count;
                      }
                     
                     //cerr << count << " -> " << resampled_prob << endl;
                     
                      if (resampled_prob == 0UL) {
                        if (oneByOne) {
                          names.resetString();
                        } else {
                          names.reset_length (nameLengths.value (nameLengths.length()-2));
                        }
                        nameLengths.remove(nameLengths.length()-1);
                        include_me = false;
                        continue;
                      } else {
                        count = resampled_prob;
                      }
                      
                    }
                    if (oneByOne) {
                      sequenceInstances->resetVector();
                    }
                    sequenceInstances->appendValue(count);
                  }
               }
              
                
            }
            else {
              if (include_me) {
                names.appendChar(currentC);
              }
            }
            break;
          }
          case 2: {
            currentC = toupper (currentC);
            if (validFlags [currentC] >= 0) {
              if (include_me)
                //cout << "Append " << currentC << endl;
                sequences.appendChar (validFlags [currentC]);
            }
            else {
              if (currentC == '>' || currentC == '#') {
                automatonState = 1;
                if (include_me) {
                  if (oneByOne) {
                    if (firstSequenceLength == 0) {
                      firstSequenceLength = sequences.length()-1;
                    }
                      //cerr << endl << "Returning a sequence" << endl;
                    automatonState = 0;
                    sequences.appendChar ('\0');
                    ungetc (currentC, F);
                    funlockfile (F);
                    return 2;
                  }
                  addASequenceToList (sequences, seqLengths, firstSequenceLength, names, nameLengths);
                  read_counter++;
                  if (progress && read_counter % 1024 == 0) {
                      time(&after);
                      cerr << "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                              "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                              "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress"
                              ":"
                           << setw(8) << read_counter << " sequences read (" << setw(12) << std::setprecision(3)
                           << read_counter / difftime(after, before) << " seqs/sec)";

                      after = before;
                  }
                }
                if (sequenceInstances == NULL && include_prob < 1.) {
                  include_me = genrand_int32() < up_to;
                } else {
                  include_me = true;
                }
                  
              }
            }
            break;
          }
        }
      }
      
      if (automatonState == 2 || (oneByOne && automatonState == 0)) {
          if (include_me) {
              if (oneByOne) {
                  if (firstSequenceLength == 0) {
                      firstSequenceLength = sequences.length()-1;
                  }
                  automatonState = 0;
                  sequences.appendChar ('\0');
                  funlockfile (F);
                  return 3;
              } else {
                  addASequenceToList (sequences, seqLengths, firstSequenceLength, names, nameLengths);
              }
          }
          automatonState = 1;
      } else {
        char err[256] ;
        snprintf (err, 255, "Unexpected end of file: state %d", automatonState);
        throw std::string(err);
      }
  } catch (std::string const err) {
      cerr << err << endl;
      funlockfile (F);
      return 1;
  }
  return 0;
}